

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O0

Flow * __thiscall
wasm::Precompute::precomputeExpression
          (Flow *__return_storage_ptr__,Precompute *this,Expression *curr,bool replaceExpression)

{
  Name breakTo;
  bool bVar1;
  Module *module;
  NonconstantException *anon_var_0;
  PrecomputingExpressionRunner local_160;
  Flow local_b8;
  undefined1 local_70 [8];
  Flow flow;
  bool replaceExpression_local;
  Expression *curr_local;
  Precompute *this_local;
  
  flow.breakTo.super_IString.str._M_str._7_1_ = replaceExpression;
  Flow::Flow((Flow *)local_70);
  module = Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                      ).
                      super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                      .
                      super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                    );
  PrecomputingExpressionRunner::PrecomputingExpressionRunner
            (&local_160,module,&this->getValues,&this->heapValues,
             (bool)(flow.breakTo.super_IString.str._M_str._7_1_ & 1));
  ExpressionRunner<wasm::PrecomputingExpressionRunner>::visit
            (&local_b8,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)&local_160,curr);
  Flow::operator=((Flow *)local_70,&local_b8);
  Flow::~Flow(&local_b8);
  PrecomputingExpressionRunner::~PrecomputingExpressionRunner(&local_160);
  bVar1 = Flow::breaking((Flow *)local_70);
  if ((!bVar1) && ((flow.breakTo.super_IString.str._M_str._7_1_ & 1) != 0)) {
    bVar1 = canEmitConstantFor(this,(Literals *)local_70);
    if (!bVar1) {
      breakTo.super_IString.str._M_str = DAT_03194068;
      breakTo.super_IString.str._M_len = NONCONSTANT_FLOW;
      Flow::Flow(__return_storage_ptr__,breakTo);
      goto LAB_02004a96;
    }
  }
  Flow::Flow(__return_storage_ptr__,(Flow *)local_70);
LAB_02004a96:
  Flow::~Flow((Flow *)local_70);
  return __return_storage_ptr__;
}

Assistant:

Flow precomputeExpression(Expression* curr, bool replaceExpression = true) {
    Flow flow;
    try {
      flow = PrecomputingExpressionRunner(
               getModule(), getValues, heapValues, replaceExpression)
               .visit(curr);
    } catch (NonconstantException&) {
      return Flow(NONCONSTANT_FLOW);
    }
    // If we are replacing the expression, then the resulting value must be of
    // a type we can emit a constant for.
    if (!flow.breaking() && replaceExpression &&
        !canEmitConstantFor(flow.values)) {
      return Flow(NONCONSTANT_FLOW);
    }
    return flow;
  }